

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O0

void __thiscall MidiPlayerDialog::startPlayingFiles(MidiPlayerDialog *this,QStringList *fileList)

{
  QListWidget *this_00;
  bool bVar1;
  QString *other;
  QList<QString> *t;
  QString local_a8;
  QStringList local_90;
  undefined1 local_78 [8];
  QString fileName;
  undefined1 local_48 [8];
  QForeachContainer<QList<QString>_> _container_292;
  QStringList *fileList_local;
  MidiPlayerDialog *this_local;
  
  _container_292._40_8_ = fileList;
  QListWidget::clear();
  QtPrivate::qMakeForeachContainer<QList<QString>const&>
            ((QForeachContainer<QList<QString>_> *)local_48,(QtPrivate *)_container_292._40_8_,t);
  while( true ) {
    bVar1 = QList<QString>::const_iterator::operator!=
                      ((const_iterator *)&_container_292.c.d.size,_container_292.i);
    if (!bVar1) break;
    other = QList<QString>::const_iterator::operator*((const_iterator *)&_container_292.c.d.size);
    QString::QString((QString *)local_78,other);
    this_00 = *(QListWidget **)(this->ui + 0x18);
    QString::QString(&local_a8,(QString *)local_78);
    Master::parseMidiListFromPathName(&local_90,&local_a8);
    QListWidget::addItems(this_00,&local_90);
    QList<QString>::~QList(&local_90);
    QString::~QString(&local_a8);
    QString::~QString((QString *)local_78);
    QList<QString>::const_iterator::operator++((const_iterator *)&_container_292.c.d.size);
  }
  QtPrivate::QForeachContainer<QList<QString>_>::~QForeachContainer
            ((QForeachContainer<QList<QString>_> *)local_48);
  updateCurrentItem(this);
  on_playButton_clicked(this);
  return;
}

Assistant:

void MidiPlayerDialog::startPlayingFiles(const QStringList &fileList) {
	ui->playList->clear();
	foreach (QString fileName, fileList) {
		ui->playList->addItems(Master::parseMidiListFromPathName(fileName));
	}
	updateCurrentItem();
	on_playButton_clicked();
}